

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

s3wid_t dict_wordid(dict_t *d,char *word)

{
  s3wid_t in_EAX;
  int32 iVar1;
  s3wid_t sVar2;
  void *w;
  s3wid_t local_8 [2];
  
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                  ,0x1e6,"s3wid_t dict_wordid(dict_t *, const char *)");
  }
  if (word != (char *)0x0) {
    local_8[0] = in_EAX;
    iVar1 = hash_table_lookup(d->ht,word,(void **)local_8);
    sVar2 = -1;
    if (-1 < iVar1) {
      sVar2 = local_8[0];
    }
    return sVar2;
  }
  __assert_fail("word",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                ,0x1e7,"s3wid_t dict_wordid(dict_t *, const char *)");
}

Assistant:

s3wid_t
dict_wordid(dict_t * d, const char *word)
{
    void *w;

    assert(d);
    assert(word);

    if (hash_table_lookup(d->ht, word, &w) < 0)
        return (BAD_S3WID);
    return ((s3wid_t)(long)w);
}